

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O3

int __thiscall Potassco::Application::main(Application *this,int argc,char **argv)

{
  uint __seconds;
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  __sighandler_t p_Var4;
  undefined8 extraout_RAX;
  int __how;
  Application *this_00;
  int *piVar3;
  
  instance_s = this;
  this->exitCode_ = 1;
  this->pending_ = 0;
  this->blocked_ = this->pending_;
  this_00 = this;
  bVar1 = getOptions(this,argc,argv);
  if (bVar1) {
    iVar2 = (*this->_vptr_Application[2])(this);
    piVar3 = (int *)CONCAT44(extraout_var,iVar2);
    if (piVar3 != (int *)0x0) {
      iVar2 = *piVar3;
      while (iVar2 != 0) {
        p_Var4 = signal(iVar2,sigHandler);
        if (p_Var4 == (__sighandler_t)0x1) {
          signal(*piVar3,(__sighandler_t)0x1);
        }
        iVar2 = piVar3[1];
        piVar3 = piVar3 + 1;
      }
    }
    __seconds = this->timeout_;
    if (__seconds != 0) {
      signal(0xe,sigHandler);
      alarm(__seconds);
    }
    this->exitCode_ = 0;
    (*this->_vptr_Application[0xe])(this);
    (*this->_vptr_Application[0xf])();
    LOCK();
    this->blocked_ = this->blocked_ + 1;
    UNLOCK();
    if (this->timeout_ != 0) {
      alarm(0);
    }
    this_00 = this;
    (*this->_vptr_Application[0x10])();
  }
  while (this->fastExit_ == true) {
    exit(this_00,this->exitCode_);
    __cxa_begin_catch(extraout_RAX);
    this_00 = this;
    shutdown(this,1,__how);
    __cxa_end_catch();
  }
  fflush(_stdout);
  fflush(_stderr);
  return this->exitCode_;
}

Assistant:

int Application::main(int argc, char** argv) {
	initInstance(*this); // singleton instance used for signal handling
	exitCode_ = EXIT_FAILURE;
	blocked_  = pending_ = 0;
	if (getOptions(argc, argv)) {
		// install signal handlers
		for (const int* sig = getSignals(); sig && *sig; ++sig) {
			if (signal(*sig, &Application::sigHandler) == SIG_IGN) {
				signal(*sig, SIG_IGN);
			}
		}
		if (timeout_) {
			if (setAlarm(timeout_) == 0) { warn("Could not set time limit!"); }
		}
		exitCode_ = EXIT_SUCCESS;
		try         { setup(); run(); shutdown(false); }
		catch (...) { shutdown(true); }
	}
	if (fastExit_) { exit(exitCode_); }
	fflush(stdout);
	fflush(stderr);
	return exitCode_;
}